

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::CanShortcutPrototypeChainOnUnknownPropertyName
               (RecyclableObject *prototype)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  
  if (prototype == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x15fc,"(prototype)","prototype");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pTVar5 = (prototype->type).ptr;
  while( true ) {
    bVar2 = pTVar5->typeId == TypeIds_Null;
    if (bVar2) {
      return bVar2;
    }
    bVar3 = CanShortcutInstanceOnUnknownPropertyName(prototype);
    if (!bVar3) break;
    prototype = RecyclableObject::GetPrototype(prototype);
    pTVar5 = (prototype->type).ptr;
  }
  return bVar2;
}

Assistant:

bool JavascriptOperators::CanShortcutPrototypeChainOnUnknownPropertyName(RecyclableObject *prototype)
    {
        Assert(prototype);
        for (; !JavascriptOperators::IsNull(prototype); prototype = prototype->GetPrototype())
        {
            if (!CanShortcutInstanceOnUnknownPropertyName(prototype))
            {
                return false;
            }
        }
        return true;
    }